

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

void __thiscall BasicTestingSetup::~BasicTestingSetup(BasicTestingSetup *this)

{
  ArgsManager *this_00;
  Logger *in_RDI;
  long in_FS_OFFSET;
  ArgsManager *in_stack_ffffffffffffff38;
  seconds mock_time_in;
  path local_58 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  mock_time_in.__r = (long)&(in_RDI->m_cs).super_mutex.super___mutex_base._M_mutex + 0x10;
  std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::reset
            ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)in_stack_ffffffffffffff38
             ,(pointer)0xea6ce9);
  std::unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_>::reset
            ((unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)
             in_stack_ffffffffffffff38,(pointer)0xea6cf8);
  s<(char)48>();
  SetMockTime(mock_time_in);
  this_00 = (ArgsManager *)LogInstance();
  BCLog::Logger::DisconnectTestLogger(in_RDI);
  if ((in_RDI[1].m_file_path.super_path._M_pathname._M_string_length & 1) == 0) {
    std::filesystem::remove_all((path *)&in_RDI[1].m_category_log_levels._M_h._M_rehash_policy);
  }
  else {
    fs::path::path((path *)0xea6d68,(char *)in_stack_ffffffffffffff38);
    UnlockDirectory((path *)mock_time_in.__r,(path *)in_RDI);
    fs::path::~path((path *)in_stack_ffffffffffffff38);
    fs::path::path((path *)in_stack_ffffffffffffff38,(path *)0xea6da1);
    fs::operator/((path *)in_RDI,(char *)this_00);
    std::filesystem::remove(local_58);
    fs::path::~path((path *)in_stack_ffffffffffffff38);
    fs::path::~path((path *)in_stack_ffffffffffffff38);
  }
  ArgsManager::ClearArgs(this_00);
  ArgsManager::~ArgsManager(in_stack_ffffffffffffff38);
  fs::path::~path((path *)in_stack_ffffffffffffff38);
  fs::path::~path((path *)in_stack_ffffffffffffff38);
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffff38);
  ::node::NodeContext::~NodeContext((NodeContext *)in_stack_ffffffffffffff38);
  util::SignalInterrupt::~SignalInterrupt((SignalInterrupt *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BasicTestingSetup::~BasicTestingSetup()
{
    m_node.ecc_context.reset();
    m_node.kernel.reset();
    SetMockTime(0s); // Reset mocktime for following tests
    LogInstance().DisconnectTestLogger();
    if (m_has_custom_datadir) {
        // Only remove the lock file, preserve the data directory.
        UnlockDirectory(m_path_lock, ".lock");
        fs::remove(m_path_lock / ".lock");
    } else {
        fs::remove_all(m_path_root);
    }
    gArgs.ClearArgs();
}